

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

String * kj::_::generateExtensionRequest
                   (String *__return_storage_ptr__,ArrayPtr<kj::CompressionParameters> *extensions)

{
  size_t count;
  CompressionParameters *pCVar1;
  size_t sVar2;
  String *pSVar3;
  char (*in_RCX) [29];
  StringPtr *extraout_RDX;
  StringPtr *extraout_RDX_00;
  StringPtr *extraout_RDX_01;
  StringPtr *extraout_RDX_02;
  StringPtr *extraout_RDX_03;
  StringPtr *extraout_RDX_04;
  StringPtr *params;
  unsigned_long *in_R8;
  long lVar4;
  CompressionParameters *pCVar5;
  long lVar6;
  Array<kj::String> offers;
  unsigned_long w;
  StringPtr EXT;
  Array<kj::String> local_88;
  char local_70 [8];
  String *local_68;
  Array<char> local_60;
  char *local_48;
  undefined8 uStack_40;
  
  local_48 = "permessage-deflate";
  uStack_40 = 0x13;
  count = extensions->size_;
  local_68 = __return_storage_ptr__;
  local_88.ptr = HeapArrayDisposer::allocate<kj::String>(count);
  local_88.disposer = (ArrayDisposer *)&HeapArrayDisposer::instance;
  pCVar1 = extensions->ptr;
  sVar2 = extensions->size_;
  lVar4 = 0;
  params = extraout_RDX;
  pCVar5 = pCVar1;
  local_88.size_ = count;
  for (lVar6 = 0; pSVar3 = local_68, sVar2 * 0x28 - lVar6 != 0; lVar6 = lVar6 + 0x28) {
    str<kj::StringPtr_const&>((String *)&local_60,(kj *)&local_48,params);
    Array<char>::operator=((Array<char> *)((long)&((local_88.ptr)->content).ptr + lVar4),&local_60);
    Array<char>::~Array(&local_60);
    params = extraout_RDX_00;
    if (pCVar5->outboundNoContextTakeover == true) {
      str<kj::String&,char_const(&)[29]>
                ((String *)&local_60,(kj *)((long)&((local_88.ptr)->content).ptr + lVar4),
                 (String *)"; client_no_context_takeover",in_RCX);
      Array<char>::operator=
                ((Array<char> *)((long)&((local_88.ptr)->content).ptr + lVar4),&local_60);
      Array<char>::~Array(&local_60);
      params = extraout_RDX_01;
    }
    if (pCVar5->inboundNoContextTakeover == true) {
      str<kj::String&,char_const(&)[29]>
                ((String *)&local_60,(kj *)((long)&((local_88.ptr)->content).ptr + lVar4),
                 (String *)"; server_no_context_takeover",in_RCX);
      Array<char>::operator=
                ((Array<char> *)((long)&((local_88.ptr)->content).ptr + lVar4),&local_60);
      Array<char>::~Array(&local_60);
      params = extraout_RDX_02;
    }
    if ((pCVar5->outboundMaxWindowBits).ptr.isSet == true) {
      local_70 = *(char (*) [8])((long)&(pCVar1->outboundMaxWindowBits).ptr.field_1 + lVar6);
      in_RCX = (char (*) [29])local_70;
      str<kj::String&,char_const(&)[26],unsigned_long&>
                ((String *)&local_60,(kj *)((long)&((local_88.ptr)->content).ptr + lVar4),
                 (String *)"; client_max_window_bits=",(char (*) [26])in_RCX,in_R8);
      Array<char>::operator=
                ((Array<char> *)((long)&((local_88.ptr)->content).ptr + lVar4),&local_60);
      Array<char>::~Array(&local_60);
      params = extraout_RDX_03;
    }
    if ((pCVar5->inboundMaxWindowBits).ptr.isSet == true) {
      local_70 = *(char (*) [8])((long)&(pCVar1->inboundMaxWindowBits).ptr.field_1 + lVar6);
      in_RCX = (char (*) [29])local_70;
      str<kj::String&,char_const(&)[26],unsigned_long&>
                ((String *)&local_60,(kj *)((long)&((local_88.ptr)->content).ptr + lVar4),
                 (String *)"; server_max_window_bits=",(char (*) [26])in_RCX,in_R8);
      Array<char>::operator=
                ((Array<char> *)((long)&((local_88.ptr)->content).ptr + lVar4),&local_60);
      Array<char>::~Array(&local_60);
      params = extraout_RDX_04;
    }
    pCVar5 = pCVar5 + 1;
    lVar4 = lVar4 + 0x18;
  }
  strArray<kj::Array<kj::String>&>(local_68,(kj *)&local_88,(Array<kj::String> *)", ",*in_RCX);
  Array<kj::String>::~Array(&local_88);
  return pSVar3;
}

Assistant:

kj::String generateExtensionRequest(const ArrayPtr<CompressionParameters>& extensions) {
  // Build the `Sec-WebSocket-Extensions` request from the validated parameters.
  constexpr auto EXT = "permessage-deflate"_kj;
  auto offers = kj::heapArray<String>(extensions.size());
  size_t i = 0;
  for (const auto& offer : extensions) {
    offers[i] = kj::str(EXT);
    if (offer.outboundNoContextTakeover) {
      offers[i] = kj::str(offers[i], "; client_no_context_takeover");
    }
    if (offer.inboundNoContextTakeover) {
      offers[i] = kj::str(offers[i], "; server_no_context_takeover");
    }
    if (offer.outboundMaxWindowBits != kj::none) {
      auto w = KJ_ASSERT_NONNULL(offer.outboundMaxWindowBits);
      offers[i] = kj::str(offers[i], "; client_max_window_bits=", w);
    }
    if (offer.inboundMaxWindowBits != kj::none) {
      auto w = KJ_ASSERT_NONNULL(offer.inboundMaxWindowBits);
      offers[i] = kj::str(offers[i], "; server_max_window_bits=", w);
    }
    ++i;
  }
  return kj::strArray(offers, ", ");
}